

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_table.c
# Opt level: O1

int sort_comp(lua_State *L,int a,int b)

{
  int iVar1;
  
  iVar1 = lua_type(L,2);
  if (iVar1 != 0) {
    lua_pushvalue(L,2);
    lua_pushvalue(L,a + -1);
    lua_pushvalue(L,b + -2);
    lua_call(L,2,1);
    iVar1 = lua_toboolean(L,-1);
    lua_settop(L,-2);
    return iVar1;
  }
  iVar1 = lua_lessthan(L,a,b);
  return iVar1;
}

Assistant:

static int sort_comp(lua_State *L, int a, int b)
{
  if (!lua_isnil(L, 2)) {  /* function? */
    int res;
    lua_pushvalue(L, 2);
    lua_pushvalue(L, a-1);  /* -1 to compensate function */
    lua_pushvalue(L, b-2);  /* -2 to compensate function and `a' */
    lua_call(L, 2, 1);
    res = lua_toboolean(L, -1);
    lua_pop(L, 1);
    return res;
  } else {  /* a < b? */
    return lua_lessthan(L, a, b);
  }
}